

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

void __thiscall bloaty::Bloaty::Bloaty(Bloaty *this,InputFileFactory *factory,Options *options)

{
  _Rb_tree_header *p_Var1;
  
  this->file_factory_ = factory;
  Options::Options(&this->options_,options);
  p_Var1 = &(this->all_known_sources_)._M_t._M_impl.super__Rb_tree_header;
  (this->all_known_sources_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->all_known_sources_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->all_known_sources_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->all_known_sources_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->debug_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->debug_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->debug_files_)._M_t._M_impl.super__Rb_tree_header;
  (this->all_known_sources_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->sources_).
  super__Vector_base<bloaty::ConfiguredDataSource_*,_std::allocator<bloaty::ConfiguredDataSource_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sources_).
  super__Vector_base<bloaty::ConfiguredDataSource_*,_std::allocator<bloaty::ConfiguredDataSource_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sources_).
  super__Vector_base<bloaty::ConfiguredDataSource_*,_std::allocator<bloaty::ConfiguredDataSource_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->source_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->source_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->source_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->input_files_).
  super__Vector_base<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->input_files_).
  super__Vector_base<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->input_files_).
  super__Vector_base<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->base_files_).
  super__Vector_base<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->base_files_).
  super__Vector_base<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->base_files_).
  super__Vector_base<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->debug_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->debug_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->debug_files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->sourcemap_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->sourcemap_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->sourcemap_files_)._M_t._M_impl.super__Rb_tree_header;
  (this->sourcemap_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->sourcemap_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->sourcemap_files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::make_unique<google::protobuf::Arena>();
  AddBuiltInSources<10ul>(this,(DataSourceDefinition (*) [10])&data_sources,options);
  return;
}

Assistant:

Bloaty::Bloaty(const InputFileFactory& factory, const Options& options)
    : file_factory_(factory),
      options_(options),
      arena_(std::make_unique<google::protobuf::Arena>()) {
  AddBuiltInSources(data_sources, options);
}